

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O3

bool __thiscall Minisat::SimpSolver::strengthenClause(SimpSolver *this,CRef cr,Lit l)

{
  uint64_t *puVar1;
  int *piVar2;
  anon_struct_8_10_eb538618_for_header *c;
  vec<unsigned_int> *pvVar3;
  byte bVar4;
  Lit p;
  uint *puVar5;
  FILE *drup_file;
  FILE *__stream;
  uchar *puVar6;
  OnlineProofChecker *this_00;
  byte *pbVar7;
  vec<unsigned_int> *pvVar8;
  CRef CVar9;
  anon_struct_8_10_eb538618_for_header aVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  int n;
  ulong uVar14;
  uint uVar15;
  bool bVar16;
  
  puVar5 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
  c = (anon_struct_8_10_eb538618_for_header *)(puVar5 + cr);
  puVar1 = &(this->super_Solver).statistics.simpSteps;
  *puVar1 = *puVar1 + 1;
  Queue<unsigned_int>::insert(&this->subsumption_queue,cr);
  drup_file = (this->super_Solver).drup_file;
  if (drup_file != (FILE *)0x0) {
    Solver::binDRUP_strengthen(&this->super_Solver,(Clause *)c,l,drup_file);
  }
  if (SUB84(*c,4) >> 2 == 2) {
    removeClause(this,cr);
    aVar10 = *c;
    uVar12 = (ulong)aVar10 >> 0x22;
    uVar13 = 0;
    if ((ulong)aVar10 < 0x400000000) {
LAB_001282a6:
      uVar15 = (aVar10._4_4_ >> 2) - 1;
      if ((int)uVar13 < (int)uVar15) {
        uVar13 = uVar13 & 0xffffffff;
        do {
          puVar5[(ulong)cr + uVar13 + 2] = puVar5[(ulong)cr + uVar13 + 3];
          uVar13 = uVar13 + 1;
        } while (uVar15 != uVar13);
      }
    }
    else {
      uVar13 = 0;
      do {
        if (*(int *)(&c[1].field_0x0 + uVar13 * 4) == l.x) goto LAB_001282a6;
        uVar13 = uVar13 + 1;
      } while (uVar12 != uVar13);
    }
    if (((ulong)aVar10 & 8) != 0) {
      *(undefined4 *)(&c->field_0x4 + uVar12 * 4) = *(undefined4 *)(&c[1].field_0x0 + uVar12 * 4);
      aVar10 = *c;
    }
    uVar13 = ((ulong)aVar10 & 0xfffffffc00000000) - 0x400000000;
    *c = (anon_struct_8_10_eb538618_for_header)((ulong)aVar10 & 0x3ffffffff | uVar13);
    if (uVar13 == 0) {
      uVar15 = 0;
    }
    else {
      uVar12 = 0;
      uVar15 = 0;
      do {
        uVar15 = uVar15 | 1 << ((byte)(&c[1].field_0x0)[uVar12 * 4] >> 1 & 0x1f);
        uVar12 = uVar12 + 1;
      } while (uVar13 >> 0x22 != uVar12);
    }
    *(uint *)(&c[1].field_0x0 + (uVar13 >> 0x22) * 4) = uVar15;
  }
  else {
    __stream = (FILE *)(this->super_Solver).drup_file;
    if (__stream != (FILE *)0x0) {
      puVar6 = (this->super_Solver).buf_ptr;
      (this->super_Solver).buf_ptr = puVar6 + 1;
      *puVar6 = 'd';
      piVar2 = &(this->super_Solver).buf_len;
      *piVar2 = *piVar2 + 1;
      this_00 = (this->super_Solver).onlineDratChecker;
      if ((this_00 != (OnlineProofChecker *)0x0) &&
         (bVar16 = OnlineProofChecker::removeClause<Minisat::Clause>(this_00,(Clause *)c), !bVar16))
      {
        exit(0x86);
      }
      if (0x3ffffffff < (ulong)*c) {
        uVar13 = 0;
        do {
          uVar15 = *(int *)(&c[1].field_0x0 + uVar13 * 4) + 2;
          do {
            pbVar7 = (this->super_Solver).buf_ptr;
            (this->super_Solver).buf_ptr = pbVar7 + 1;
            *pbVar7 = (byte)uVar15 | 0x80;
            piVar2 = &(this->super_Solver).buf_len;
            *piVar2 = *piVar2 + 1;
            bVar16 = 0x7f < uVar15;
            uVar15 = uVar15 >> 7;
          } while (bVar16);
          pbVar7 = (this->super_Solver).buf_ptr + -1;
          *pbVar7 = *pbVar7 & 0x7f;
          uVar13 = uVar13 + 1;
        } while (uVar13 < (ulong)*c >> 0x22);
      }
      puVar6 = (this->super_Solver).buf_ptr;
      (this->super_Solver).buf_ptr = puVar6 + 1;
      *puVar6 = '\0';
      iVar11 = (this->super_Solver).buf_len;
      uVar15 = iVar11 + 1;
      (this->super_Solver).buf_len = uVar15;
      if (0xfffff < iVar11) {
        fwrite_unlocked(Solver::drup_buf,1,(ulong)uVar15,__stream);
        (this->super_Solver).buf_ptr = Solver::drup_buf;
        (this->super_Solver).buf_len = 0;
      }
    }
    Solver::detachClause(&this->super_Solver,cr,true);
    aVar10 = *c;
    uVar12 = (ulong)aVar10 >> 0x22;
    uVar13 = 0;
    if ((ulong)aVar10 < 0x400000000) {
LAB_00128415:
      uVar15 = (aVar10._4_4_ >> 2) - 1;
      if ((int)uVar13 < (int)uVar15) {
        uVar13 = uVar13 & 0xffffffff;
        do {
          puVar5[(ulong)cr + uVar13 + 2] = puVar5[(ulong)cr + uVar13 + 3];
          uVar13 = uVar13 + 1;
        } while (uVar15 != uVar13);
      }
    }
    else {
      uVar13 = 0;
      do {
        if (*(int *)(&c[1].field_0x0 + uVar13 * 4) == l.x) goto LAB_00128415;
        uVar13 = uVar13 + 1;
      } while (uVar12 != uVar13);
    }
    if (((ulong)aVar10 & 8) != 0) {
      *(undefined4 *)(&c->field_0x4 + uVar12 * 4) = *(undefined4 *)(&c[1].field_0x0 + uVar12 * 4);
      aVar10 = *c;
    }
    uVar12 = ((ulong)aVar10 & 0xfffffffc00000000) - 0x400000000;
    *c = (anon_struct_8_10_eb538618_for_header)((ulong)aVar10 & 0x3ffffffff | uVar12);
    uVar13 = 0;
    uVar15 = 0;
    if (uVar12 != 0) {
      uVar14 = 0;
      uVar15 = 0;
      do {
        uVar15 = uVar15 | 1 << ((byte)(&c[1].field_0x0)[uVar14 * 4] >> 1 & 0x1f);
        uVar14 = uVar14 + 1;
      } while (uVar12 >> 0x22 != uVar14);
    }
    *(uint *)(&c[1].field_0x0 + (uVar12 >> 0x22) * 4) = uVar15;
    Solver::attachClause(&this->super_Solver,cr);
    n = l.x >> 1;
    pvVar8 = (this->occurs).occs.data;
    pvVar3 = pvVar8 + n;
    iVar11 = pvVar8[n].sz;
    if ((long)iVar11 < 1) {
LAB_00128565:
      iVar11 = iVar11 + -1;
      if ((int)uVar13 < iVar11) {
        puVar5 = pvVar3->data;
        uVar13 = uVar13 & 0xffffffff;
        do {
          puVar5[uVar13] = puVar5[uVar13 + 1];
          uVar13 = uVar13 + 1;
          iVar11 = pvVar3->sz + -1;
        } while ((int)uVar13 < iVar11);
      }
    }
    else {
      uVar13 = 0;
      do {
        if (pvVar3->data[uVar13] == cr) goto LAB_00128565;
        uVar13 = uVar13 + 1;
      } while ((long)iVar11 != uVar13);
      iVar11 = iVar11 + -1;
    }
    pvVar3->sz = iVar11;
    piVar2 = (this->n_occ).data + l.x;
    *piVar2 = *piVar2 + -1;
    if (((n < (this->elim_heap).indices.sz) && (-1 < (this->elim_heap).indices.data[n])) ||
       (((this->frozen).data[n] == '\0' &&
        (((this->eliminated).data[n] == '\0' &&
         (((this->super_Solver).assigns.data[n].value & 2) != 0)))))) {
      Heap<Minisat::SimpSolver::ElimLt>::update(&this->elim_heap,n);
    }
  }
  bVar16 = true;
  if (((ulong)*c & 0xfffffffc00000000) == 0x400000000) {
    p.x = *(int *)(c + 1);
    bVar4 = (this->super_Solver).assigns.data[p.x >> 1].value;
    if ((bVar4 & 2) == 0) {
      if ((bVar4 ^ (byte)p.x & 1) == 1) {
        return false;
      }
    }
    else {
      Solver::uncheckedEnqueue(&this->super_Solver,p,(this->super_Solver).trail_lim.sz,0xffffffff);
    }
    CVar9 = Solver::propagate(&this->super_Solver);
    bVar16 = CVar9 == 0xffffffff;
  }
  return bVar16;
}

Assistant:

bool SimpSolver::strengthenClause(CRef cr, Lit l)
{
    Clause &c = ca[cr];
    statistics.simpSteps++;
    assert(decisionLevel() == 0);
    assert(use_simplification);

    // FIX: this is too inefficient but would be nice to have (properly implemented)
    // if (!find(subsumption_queue, &c))
    subsumption_queue.insert(cr);

    if (drup_file) {
#ifdef BIN_DRUP
        binDRUP_strengthen(c, l, drup_file);
#else
        for (int i = 0; i < c.size(); i++)
            if (c[i] != l) fprintf(drup_file, "%i ", (var(c[i]) + 1) * (-2 * sign(c[i]) + 1));
        fprintf(drup_file, "0\n");
#endif
    }

    if (c.size() == 2) {
        removeClause(cr);
        c.strengthen(l);
    } else {
        if (drup_file) {
#ifdef BIN_DRUP
            binDRUP('d', c, drup_file);
#else
            fprintf(drup_file, "d ");
            for (int i = 0; i < c.size(); i++) fprintf(drup_file, "%i ", (var(c[i]) + 1) * (-2 * sign(c[i]) + 1));
            fprintf(drup_file, "0\n");
#endif
        }

        detachClause(cr, true);
        c.strengthen(l);
        attachClause(cr);
        remove(occurs[var(l)], cr);
        n_occ[toInt(l)]--;
        updateElimHeap(var(l));
    }

    return c.size() == 1 ? enqueue(c[0]) && propagate() == CRef_Undef : true;
}